

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_destroy(char *fname,fdb_config *fdbconfig)

{
  bool bVar1;
  fdb_status fVar2;
  fdb_config local_570;
  filemgr_config fconfig;
  char local_418 [1032];
  
  if (fdbconfig == (fdb_config *)0x0) {
    get_default_config();
  }
  else {
    bVar1 = validate_fdb_config(fdbconfig);
    if (!bVar1) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    memcpy(&local_570,fdbconfig,0xf8);
  }
  strncpy(local_418,fname,0x400);
  bVar1 = compactor_is_valid_mode(local_418,&local_570);
  if (bVar1) {
    _fdb_init_file_config(&local_570,&fconfig);
    filemgr_mutex_openlock(&fconfig);
    fVar2 = filemgr_destroy_file(local_418,&fconfig,(hash *)0x0);
    if ((fVar2 == FDB_RESULT_SUCCESS || local_570.compaction_mode == '\x01') &&
        local_570.compaction_mode == '\x01') {
      fVar2 = compactor_destroy_file(local_418,&local_570);
    }
    filemgr_mutex_openunlock();
  }
  else {
    fVar2 = FDB_RESULT_INVALID_COMPACTION_MODE;
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_destroy(const char *fname,
                       fdb_config *fdbconfig)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    fdb_config config;
    struct filemgr_config fconfig;
    fdb_status status = FDB_RESULT_SUCCESS;
    char *filename = (char *)alca(uint8_t, FDB_MAX_FILENAME_LEN);

    if (fdbconfig) {
        if (validate_fdb_config(fdbconfig)) {
            config = *fdbconfig;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        config = get_default_config();
    }

    strncpy(filename, fname, FDB_MAX_FILENAME_LEN);

    if (!compactor_is_valid_mode(filename, &config)) {
        status = FDB_RESULT_INVALID_COMPACTION_MODE;
        return status;
    }

    _fdb_init_file_config(&config, &fconfig);

    filemgr_mutex_openlock(&fconfig);

    // Destroy file whose name is exactly matched.
    // In auto compaction mode, exact matching file name will not exist in
    // file system, so we allow failure returned by this function.
    status = filemgr_destroy_file(filename, &fconfig, NULL);
    if (status != FDB_RESULT_SUCCESS &&
        config.compaction_mode != FDB_COMPACTION_AUTO) {
        filemgr_mutex_openunlock();
        return status;
    }

    if (config.compaction_mode == FDB_COMPACTION_AUTO) {
        // Destroy all files whose prefix is matched.
        status = compactor_destroy_file(filename, &config);
        if (status != FDB_RESULT_SUCCESS) {
            filemgr_mutex_openunlock();
            return status;
        }
    }

    filemgr_mutex_openunlock();

    return status;
}